

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  float fVar2;
  uint uVar3;
  BVH *bvh;
  NodeRef root;
  float *pfVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  size_t k;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [12];
  vbool<4> vVar24;
  uint uVar25;
  int iVar26;
  float *vertices;
  ulong uVar27;
  undefined4 uVar28;
  ulong uVar29;
  long lVar30;
  uint uVar31;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar32;
  ulong uVar33;
  ulong uVar34;
  NodeRef *pNVar35;
  bool bVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [64];
  float fVar109;
  float fVar113;
  float fVar114;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar115;
  undefined1 auVar116 [16];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  float fVar119;
  undefined1 auVar120 [16];
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 in_ZMM14 [64];
  undefined1 auVar121 [64];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar125;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [64];
  Precalculations pre;
  float local_1a98;
  float fStack_1a94;
  float fStack_1a90;
  vbool<4> terminated;
  undefined1 local_1a18 [16];
  ulong local_1a00;
  Scene *local_19f8;
  vuint<4> *v;
  RTCFilterFunctionNArguments args;
  TravRayK<4,_true> tray;
  undefined1 local_18b8 [16];
  undefined1 local_18a8 [16];
  undefined1 local_1898 [16];
  undefined1 local_1888 [16];
  undefined1 local_1878 [16];
  undefined1 local_1868 [8];
  float fStack_1860;
  float fStack_185c;
  undefined1 local_1858 [8];
  float fStack_1850;
  float fStack_184c;
  longlong local_1788;
  longlong lStack_1780;
  longlong local_1778;
  longlong lStack_1770;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined8 local_1758;
  undefined8 uStack_1750;
  undefined1 local_1748 [16];
  undefined1 local_1738 [16];
  undefined1 local_1728 [16];
  undefined1 local_1718 [16];
  uint local_1708;
  uint uStack_1704;
  uint uStack_1700;
  uint uStack_16fc;
  uint local_16f8;
  uint uStack_16f4;
  uint uStack_16f0;
  uint uStack_16ec;
  uint uStack_16e8;
  uint uStack_16e4;
  uint uStack_16e0;
  uint uStack_16dc;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  undefined1 auVar112 [64];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar71 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar72 = vpcmpeqd_avx(auVar71,(undefined1  [16])valid_i->field_0);
    auVar57 = ZEXT816(0) << 0x40;
    auVar10 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar57,5);
    auVar77 = auVar72 & auVar10;
    if ((((auVar77 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar77 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar77 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar77[0xf] < '\0')
    {
      auVar10 = vandps_avx(auVar10,auVar72);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar110._8_4_ = 0x7fffffff;
      auVar110._0_8_ = 0x7fffffff7fffffff;
      auVar110._12_4_ = 0x7fffffff;
      auVar112 = ZEXT1664(auVar110);
      auVar72 = vandps_avx(auVar110,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar103._8_4_ = 0x219392ef;
      auVar103._0_8_ = 0x219392ef219392ef;
      auVar103._12_4_ = 0x219392ef;
      auVar77 = vcmpps_avx(auVar72,auVar103,1);
      auVar116._8_4_ = 0x3f800000;
      auVar116._0_8_ = &DAT_3f8000003f800000;
      auVar116._12_4_ = 0x3f800000;
      auVar90 = vdivps_avx(auVar116,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar72 = vandps_avx(auVar110,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar58 = vcmpps_avx(auVar72,auVar103,1);
      auVar91 = vdivps_avx(auVar116,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar72 = vandps_avx(auVar110,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar72 = vcmpps_avx(auVar72,auVar103,1);
      auVar92 = vdivps_avx(auVar116,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar104._8_4_ = 0x5d5e0b6b;
      auVar104._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar104._12_4_ = 0x5d5e0b6b;
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar90,auVar104,auVar77);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar91,auVar104,auVar58);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar92,auVar104,auVar72);
      auVar72 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar57,1);
      auVar90._8_4_ = 0x10;
      auVar90._0_8_ = 0x1000000010;
      auVar90._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar72,auVar90);
      auVar72 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar57,5);
      auVar77._8_4_ = 0x20;
      auVar77._0_8_ = 0x2000000020;
      auVar77._12_4_ = 0x20;
      auVar91._8_4_ = 0x30;
      auVar91._0_8_ = 0x3000000030;
      auVar91._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar91,auVar77,auVar72);
      auVar72 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar57,5);
      auVar58._8_4_ = 0x40;
      auVar58._0_8_ = 0x4000000040;
      auVar58._12_4_ = 0x40;
      auVar92._8_4_ = 0x50;
      auVar92._0_8_ = 0x5000000050;
      auVar92._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar92,auVar58,auVar72);
      auVar72 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar57);
      auVar77 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar57);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar117 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar72,auVar10);
      auVar72._8_4_ = 0xff800000;
      auVar72._0_8_ = 0xff800000ff800000;
      auVar72._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar72,auVar77,auVar10);
      terminated.field_0._0_4_ = auVar10._0_4_ ^ auVar71._0_4_;
      terminated.field_0._4_4_ = auVar10._4_4_ ^ auVar71._4_4_;
      terminated.field_0._8_4_ = auVar10._8_4_ ^ auVar71._8_4_;
      terminated.field_0._12_4_ = auVar10._12_4_ ^ auVar71._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar31 = 3;
      }
      else {
        uVar31 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      pNVar35 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar32 = &stack_near[2].field_0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar108 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
      auVar118 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
      auVar71 = vpcmpeqd_avx(in_ZMM14._0_16_,in_ZMM14._0_16_);
      auVar121 = ZEXT1664(auVar71);
LAB_0053a932:
      paVar32 = paVar32 + -1;
      root.ptr = pNVar35[-1].ptr;
      pNVar35 = pNVar35 + -1;
      if (root.ptr == 0xfffffffffffffff8) goto LAB_0053b432;
      aVar125 = *paVar32;
      auVar71 = vcmpps_avx((undefined1  [16])aVar125,(undefined1  [16])tray.tfar.field_0,1);
      uVar25 = vmovmskps_avx(auVar71);
      if (uVar25 == 0) {
        iVar26 = 2;
      }
      else {
        uVar34 = (ulong)(uVar25 & 0xff);
        uVar25 = POPCOUNT(uVar25 & 0xff);
        iVar26 = 0;
        if (uVar25 <= uVar31) {
          do {
            k = 0;
            for (uVar27 = uVar34; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
              k = k + 1;
            }
            auVar121 = ZEXT1664(auVar121._0_16_);
            bVar36 = occluded1(This,bvh,root,k,&pre,ray,&tray,context);
            if (bVar36) {
              terminated.field_0.i[k] = -1;
            }
            uVar34 = uVar34 - 1 & uVar34;
          } while (uVar34 != 0);
          auVar71 = vpcmpeqd_avx(auVar121._0_16_,auVar121._0_16_);
          auVar121 = ZEXT1664(auVar71);
          auVar71 = auVar71 & ~(undefined1  [16])terminated.field_0;
          iVar26 = 3;
          auVar112 = ZEXT1664(auVar112._0_16_);
          auVar117 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar108 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar118 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
          if ((((auVar71 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar71 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar71 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar71[0xf] < '\0') {
            auVar71._8_4_ = 0xff800000;
            auVar71._0_8_ = 0xff800000ff800000;
            auVar71._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar71,
                               (undefined1  [16])terminated.field_0);
            iVar26 = 2;
          }
        }
        vVar24.field_0 = terminated.field_0;
        if (uVar31 < uVar25) {
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_0053b432;
              auVar71 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar125,6);
              if ((((auVar71 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar71 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar71 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar71[0xf] < '\0') {
                uVar34 = (ulong)((uint)root.ptr & 0xf);
                if (uVar34 == 8) goto LAB_0053b3f7;
                lVar30 = (root.ptr & 0xfffffffffffffff0) + 0x40;
                uVar27 = 0;
                auVar72 = auVar112._0_16_;
                auVar71 = auVar121._0_16_ ^ (undefined1  [16])terminated.field_0;
                goto LAB_0053ab76;
              }
              iVar26 = 2;
              break;
            }
            auVar128 = ZEXT1664(auVar117._0_16_);
            uVar34 = 0;
            uVar27 = 8;
            do {
              uVar33 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + uVar34 * 8);
              if (uVar33 != 8) {
                uVar28 = *(undefined4 *)(root.ptr + 0x20 + uVar34 * 4);
                auVar37._4_4_ = uVar28;
                auVar37._0_4_ = uVar28;
                auVar37._8_4_ = uVar28;
                auVar37._12_4_ = uVar28;
                auVar19._8_8_ = tray.org.field_0._8_8_;
                auVar19._0_8_ = tray.org.field_0._0_8_;
                auVar20._8_8_ = tray.org.field_0._24_8_;
                auVar20._0_8_ = tray.org.field_0._16_8_;
                auVar21._8_8_ = tray.org.field_0._40_8_;
                auVar21._0_8_ = tray.org.field_0._32_8_;
                auVar71 = vsubps_avx(auVar37,auVar19);
                auVar83._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar71._0_4_;
                auVar83._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar71._4_4_;
                auVar83._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar71._8_4_;
                auVar83._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar71._12_4_;
                uVar28 = *(undefined4 *)(root.ptr + 0x40 + uVar34 * 4);
                auVar38._4_4_ = uVar28;
                auVar38._0_4_ = uVar28;
                auVar38._8_4_ = uVar28;
                auVar38._12_4_ = uVar28;
                auVar71 = vsubps_avx(auVar38,auVar20);
                auVar97._0_4_ = tray.rdir.field_0._16_4_ * auVar71._0_4_;
                auVar97._4_4_ = tray.rdir.field_0._20_4_ * auVar71._4_4_;
                auVar97._8_4_ = tray.rdir.field_0._24_4_ * auVar71._8_4_;
                auVar97._12_4_ = tray.rdir.field_0._28_4_ * auVar71._12_4_;
                uVar28 = *(undefined4 *)(root.ptr + 0x60 + uVar34 * 4);
                auVar39._4_4_ = uVar28;
                auVar39._0_4_ = uVar28;
                auVar39._8_4_ = uVar28;
                auVar39._12_4_ = uVar28;
                auVar71 = vsubps_avx(auVar39,auVar21);
                auVar105._0_4_ = tray.rdir.field_0._32_4_ * auVar71._0_4_;
                auVar105._4_4_ = tray.rdir.field_0._36_4_ * auVar71._4_4_;
                auVar105._8_4_ = tray.rdir.field_0._40_4_ * auVar71._8_4_;
                auVar105._12_4_ = tray.rdir.field_0._44_4_ * auVar71._12_4_;
                uVar28 = *(undefined4 *)(root.ptr + 0x30 + uVar34 * 4);
                auVar40._4_4_ = uVar28;
                auVar40._0_4_ = uVar28;
                auVar40._8_4_ = uVar28;
                auVar40._12_4_ = uVar28;
                auVar71 = vsubps_avx(auVar40,auVar19);
                auVar49._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar71._0_4_;
                auVar49._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar71._4_4_;
                auVar49._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar71._8_4_;
                auVar49._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar71._12_4_;
                uVar28 = *(undefined4 *)(root.ptr + 0x50 + uVar34 * 4);
                auVar41._4_4_ = uVar28;
                auVar41._0_4_ = uVar28;
                auVar41._8_4_ = uVar28;
                auVar41._12_4_ = uVar28;
                auVar71 = vsubps_avx(auVar41,auVar20);
                auVar61._0_4_ = tray.rdir.field_0._16_4_ * auVar71._0_4_;
                auVar61._4_4_ = tray.rdir.field_0._20_4_ * auVar71._4_4_;
                auVar61._8_4_ = tray.rdir.field_0._24_4_ * auVar71._8_4_;
                auVar61._12_4_ = tray.rdir.field_0._28_4_ * auVar71._12_4_;
                uVar28 = *(undefined4 *)(root.ptr + 0x70 + uVar34 * 4);
                auVar42._4_4_ = uVar28;
                auVar42._0_4_ = uVar28;
                auVar42._8_4_ = uVar28;
                auVar42._12_4_ = uVar28;
                auVar71 = vsubps_avx(auVar42,auVar21);
                auVar73._0_4_ = tray.rdir.field_0._32_4_ * auVar71._0_4_;
                auVar73._4_4_ = tray.rdir.field_0._36_4_ * auVar71._4_4_;
                auVar73._8_4_ = tray.rdir.field_0._40_4_ * auVar71._8_4_;
                auVar73._12_4_ = tray.rdir.field_0._44_4_ * auVar71._12_4_;
                auVar71 = vminps_avx(auVar83,auVar49);
                auVar72 = vminps_avx(auVar97,auVar61);
                auVar71 = vmaxps_avx(auVar71,auVar72);
                auVar72 = vminps_avx(auVar105,auVar73);
                auVar71 = vmaxps_avx(auVar71,auVar72);
                auVar43._0_4_ = auVar108._0_4_ * auVar71._0_4_;
                auVar43._4_4_ = auVar108._4_4_ * auVar71._4_4_;
                auVar43._8_4_ = auVar108._8_4_ * auVar71._8_4_;
                auVar43._12_4_ = auVar108._12_4_ * auVar71._12_4_;
                auVar71 = vmaxps_avx(auVar83,auVar49);
                auVar72 = vmaxps_avx(auVar97,auVar61);
                auVar72 = vminps_avx(auVar71,auVar72);
                auVar71 = vmaxps_avx(auVar105,auVar73);
                auVar71 = vminps_avx(auVar72,auVar71);
                auVar50._0_4_ = auVar118._0_4_ * auVar71._0_4_;
                auVar50._4_4_ = auVar118._4_4_ * auVar71._4_4_;
                auVar50._8_4_ = auVar118._8_4_ * auVar71._8_4_;
                auVar50._12_4_ = auVar118._12_4_ * auVar71._12_4_;
                auVar71 = vmaxps_avx(auVar43,(undefined1  [16])tray.tnear.field_0);
                auVar72 = vminps_avx(auVar50,(undefined1  [16])tray.tfar.field_0);
                auVar71 = vcmpps_avx(auVar71,auVar72,2);
                if ((((auVar71 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar71 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar71 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar71[0xf] < '\0') {
                  auVar71 = vblendvps_avx(auVar117._0_16_,auVar43,auVar71);
                  if (uVar27 != 8) {
                    pNVar35->ptr = uVar27;
                    pNVar35 = pNVar35 + 1;
                    *paVar32 = auVar128._0_16_;
                    paVar32 = paVar32 + 1;
                  }
                  auVar128 = ZEXT1664(auVar71);
                  uVar27 = uVar33;
                }
              }
              aVar125 = auVar128._0_16_;
            } while ((uVar33 != 8) && (bVar36 = uVar34 < 3, uVar34 = uVar34 + 1, bVar36));
            iVar26 = 0;
            if (uVar27 == 8) {
LAB_0053ab14:
              bVar36 = false;
              iVar26 = 4;
            }
            else {
              auVar71 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar125,6);
              uVar28 = vmovmskps_avx(auVar71);
              bVar36 = true;
              if ((uint)POPCOUNT(uVar28) <= uVar31) {
                pNVar35->ptr = uVar27;
                pNVar35 = pNVar35 + 1;
                *paVar32 = aVar125;
                paVar32 = paVar32 + 1;
                goto LAB_0053ab14;
              }
            }
            root.ptr = uVar27;
          } while (bVar36);
        }
      }
      goto LAB_0053b435;
    }
  }
  return;
  while( true ) {
    uVar27 = local_1a00 + 1;
    lVar30 = lVar30 + 0x50;
    auVar71 = auVar57;
    if (uVar34 - 8 <= uVar27) break;
LAB_0053ab76:
    v = (vuint<4> *)(uVar27 * 0x50 + (root.ptr & 0xfffffffffffffff0));
    local_19f8 = context->scene;
    uVar33 = 0;
    local_1a00 = uVar27;
    auVar77 = auVar71;
    while (*(int *)(lVar30 + uVar33 * 4) != -1) {
      pfVar4 = (local_19f8->vertices).items[*(uint *)(lVar30 + -0x10 + uVar33 * 4)];
      uVar27 = (ulong)*(uint *)(lVar30 + -0x40 + uVar33 * 4);
      uVar29 = (ulong)*(uint *)(lVar30 + -0x30 + uVar33 * 4);
      fVar2 = pfVar4[uVar27];
      auVar44._4_4_ = fVar2;
      auVar44._0_4_ = fVar2;
      auVar44._8_4_ = fVar2;
      auVar44._12_4_ = fVar2;
      fVar2 = pfVar4[uVar27 + 1];
      auVar51._4_4_ = fVar2;
      auVar51._0_4_ = fVar2;
      auVar51._8_4_ = fVar2;
      auVar51._12_4_ = fVar2;
      fVar2 = pfVar4[uVar27 + 2];
      auVar62._4_4_ = fVar2;
      auVar62._0_4_ = fVar2;
      auVar62._8_4_ = fVar2;
      auVar62._12_4_ = fVar2;
      fVar2 = pfVar4[uVar29];
      auVar74._4_4_ = fVar2;
      auVar74._0_4_ = fVar2;
      auVar74._8_4_ = fVar2;
      auVar74._12_4_ = fVar2;
      fVar2 = pfVar4[uVar29 + 1];
      auVar78._4_4_ = fVar2;
      auVar78._0_4_ = fVar2;
      auVar78._8_4_ = fVar2;
      auVar78._12_4_ = fVar2;
      fVar2 = pfVar4[uVar29 + 2];
      auVar84._4_4_ = fVar2;
      auVar84._0_4_ = fVar2;
      auVar84._8_4_ = fVar2;
      auVar84._12_4_ = fVar2;
      uVar27 = (ulong)*(uint *)(lVar30 + -0x20 + uVar33 * 4);
      fVar2 = pfVar4[uVar27];
      auVar93._4_4_ = fVar2;
      auVar93._0_4_ = fVar2;
      auVar93._8_4_ = fVar2;
      auVar93._12_4_ = fVar2;
      fVar2 = pfVar4[uVar27 + 1];
      auVar120._4_4_ = fVar2;
      auVar120._0_4_ = fVar2;
      auVar120._8_4_ = fVar2;
      auVar120._12_4_ = fVar2;
      fVar2 = pfVar4[uVar27 + 2];
      auVar100._4_4_ = fVar2;
      auVar100._0_4_ = fVar2;
      auVar100._8_4_ = fVar2;
      auVar100._12_4_ = fVar2;
      local_1778 = v[3].field_0.v[0];
      lStack_1770 = v[3].field_0.v[1];
      local_1788 = v[4].field_0.v[0];
      lStack_1780 = v[4].field_0.v[1];
      auVar57 = *(undefined1 (*) [16])ray;
      auVar58 = *(undefined1 (*) [16])(ray + 0x10);
      auVar90 = *(undefined1 (*) [16])(ray + 0x20);
      auVar92 = vsubps_avx(auVar44,auVar57);
      auVar103 = vsubps_avx(auVar51,auVar58);
      auVar91 = vsubps_avx(auVar62,auVar90);
      auVar104 = vsubps_avx(auVar74,auVar57);
      auVar110 = vsubps_avx(auVar78,auVar58);
      auVar116 = vsubps_avx(auVar84,auVar90);
      auVar44 = vsubps_avx(auVar93,auVar57);
      auVar46 = vsubps_avx(auVar120,auVar58);
      auVar90 = vsubps_avx(auVar100,auVar90);
      auVar51 = vsubps_avx(auVar44,auVar92);
      auVar62 = vsubps_avx(auVar46,auVar103);
      auVar74 = vsubps_avx(auVar90,auVar91);
      auVar57._0_4_ = auVar44._0_4_ + auVar92._0_4_;
      auVar57._4_4_ = auVar44._4_4_ + auVar92._4_4_;
      auVar57._8_4_ = auVar44._8_4_ + auVar92._8_4_;
      auVar57._12_4_ = auVar44._12_4_ + auVar92._12_4_;
      auVar94._0_4_ = auVar103._0_4_ + auVar46._0_4_;
      auVar94._4_4_ = auVar103._4_4_ + auVar46._4_4_;
      auVar94._8_4_ = auVar103._8_4_ + auVar46._8_4_;
      auVar94._12_4_ = auVar103._12_4_ + auVar46._12_4_;
      fVar2 = auVar91._0_4_;
      auVar101._0_4_ = auVar90._0_4_ + fVar2;
      fVar7 = auVar91._4_4_;
      auVar101._4_4_ = auVar90._4_4_ + fVar7;
      fVar8 = auVar91._8_4_;
      auVar101._8_4_ = auVar90._8_4_ + fVar8;
      fVar9 = auVar91._12_4_;
      auVar101._12_4_ = auVar90._12_4_ + fVar9;
      auVar111._0_4_ = auVar74._0_4_ * auVar94._0_4_;
      auVar111._4_4_ = auVar74._4_4_ * auVar94._4_4_;
      auVar111._8_4_ = auVar74._8_4_ * auVar94._8_4_;
      auVar111._12_4_ = auVar74._12_4_ * auVar94._12_4_;
      auVar78 = vfmsub231ps_fma(auVar111,auVar62,auVar101);
      auVar107._0_4_ = auVar101._0_4_ * auVar51._0_4_;
      auVar107._4_4_ = auVar101._4_4_ * auVar51._4_4_;
      auVar107._8_4_ = auVar101._8_4_ * auVar51._8_4_;
      auVar107._12_4_ = auVar101._12_4_ * auVar51._12_4_;
      auVar58 = vfmsub231ps_fma(auVar107,auVar74,auVar57);
      auVar75._0_4_ = auVar62._0_4_ * auVar57._0_4_;
      auVar75._4_4_ = auVar62._4_4_ * auVar57._4_4_;
      auVar75._8_4_ = auVar62._8_4_ * auVar57._8_4_;
      auVar75._12_4_ = auVar62._12_4_ * auVar57._12_4_;
      auVar57 = vfmsub231ps_fma(auVar75,auVar51,auVar94);
      fVar15 = *(float *)(ray + 0x60);
      fVar16 = *(float *)(ray + 100);
      fVar17 = *(float *)(ray + 0x68);
      auVar23 = *(undefined1 (*) [12])(ray + 0x60);
      fVar18 = *(float *)(ray + 0x6c);
      auVar76._0_4_ = fVar15 * auVar57._0_4_;
      auVar76._4_4_ = fVar16 * auVar57._4_4_;
      auVar76._8_4_ = fVar17 * auVar57._8_4_;
      auVar76._12_4_ = fVar18 * auVar57._12_4_;
      auVar57 = *(undefined1 (*) [16])(ray + 0x50);
      auVar75 = vfmadd231ps_fma(auVar76,auVar57,auVar58);
      auVar58 = *(undefined1 (*) [16])(ray + 0x40);
      auVar93 = vfmadd231ps_fma(auVar75,auVar58,auVar78);
      auVar75 = vsubps_avx(auVar103,auVar110);
      auVar78 = vsubps_avx(auVar91,auVar116);
      auVar95._0_4_ = auVar103._0_4_ + auVar110._0_4_;
      auVar95._4_4_ = auVar103._4_4_ + auVar110._4_4_;
      auVar95._8_4_ = auVar103._8_4_ + auVar110._8_4_;
      auVar95._12_4_ = auVar103._12_4_ + auVar110._12_4_;
      auVar126._0_4_ = fVar2 + auVar116._0_4_;
      auVar126._4_4_ = fVar7 + auVar116._4_4_;
      auVar126._8_4_ = fVar8 + auVar116._8_4_;
      auVar126._12_4_ = fVar9 + auVar116._12_4_;
      fVar119 = auVar78._0_4_;
      auVar85._0_4_ = fVar119 * auVar95._0_4_;
      fVar122 = auVar78._4_4_;
      auVar85._4_4_ = fVar122 * auVar95._4_4_;
      fVar123 = auVar78._8_4_;
      auVar85._8_4_ = fVar123 * auVar95._8_4_;
      fVar124 = auVar78._12_4_;
      auVar85._12_4_ = fVar124 * auVar95._12_4_;
      auVar84 = vfmsub231ps_fma(auVar85,auVar75,auVar126);
      auVar76 = vsubps_avx(auVar92,auVar104);
      fVar11 = auVar76._0_4_;
      auVar127._0_4_ = auVar126._0_4_ * fVar11;
      fVar12 = auVar76._4_4_;
      auVar127._4_4_ = auVar126._4_4_ * fVar12;
      fVar13 = auVar76._8_4_;
      auVar127._8_4_ = auVar126._8_4_ * fVar13;
      fVar14 = auVar76._12_4_;
      auVar127._12_4_ = auVar126._12_4_ * fVar14;
      auVar98._0_4_ = auVar104._0_4_ + auVar92._0_4_;
      auVar98._4_4_ = auVar104._4_4_ + auVar92._4_4_;
      auVar98._8_4_ = auVar104._8_4_ + auVar92._8_4_;
      auVar98._12_4_ = auVar104._12_4_ + auVar92._12_4_;
      auVar91 = vfmsub231ps_fma(auVar127,auVar78,auVar98);
      fVar109 = auVar75._0_4_;
      auVar99._0_4_ = fVar109 * auVar98._0_4_;
      fVar113 = auVar75._4_4_;
      auVar99._4_4_ = fVar113 * auVar98._4_4_;
      fVar114 = auVar75._8_4_;
      auVar99._8_4_ = fVar114 * auVar98._8_4_;
      fVar115 = auVar75._12_4_;
      auVar99._12_4_ = fVar115 * auVar98._12_4_;
      auVar85 = vfmsub231ps_fma(auVar99,auVar76,auVar95);
      auVar96._0_4_ = fVar15 * auVar85._0_4_;
      auVar96._4_4_ = fVar16 * auVar85._4_4_;
      auVar96._8_4_ = fVar17 * auVar85._8_4_;
      auVar96._12_4_ = fVar18 * auVar85._12_4_;
      auVar91 = vfmadd231ps_fma(auVar96,auVar57,auVar91);
      auVar85 = vfmadd231ps_fma(auVar91,auVar58,auVar84);
      auVar84 = vsubps_avx(auVar104,auVar44);
      auVar52._0_4_ = auVar104._0_4_ + auVar44._0_4_;
      auVar52._4_4_ = auVar104._4_4_ + auVar44._4_4_;
      auVar52._8_4_ = auVar104._8_4_ + auVar44._8_4_;
      auVar52._12_4_ = auVar104._12_4_ + auVar44._12_4_;
      auVar104 = vsubps_avx(auVar110,auVar46);
      auVar45._0_4_ = auVar110._0_4_ + auVar46._0_4_;
      auVar45._4_4_ = auVar110._4_4_ + auVar46._4_4_;
      auVar45._8_4_ = auVar110._8_4_ + auVar46._8_4_;
      auVar45._12_4_ = auVar110._12_4_ + auVar46._12_4_;
      auVar110 = vsubps_avx(auVar116,auVar90);
      auVar63._0_4_ = auVar116._0_4_ + auVar90._0_4_;
      auVar63._4_4_ = auVar116._4_4_ + auVar90._4_4_;
      auVar63._8_4_ = auVar116._8_4_ + auVar90._8_4_;
      auVar63._12_4_ = auVar116._12_4_ + auVar90._12_4_;
      auVar79._0_4_ = auVar110._0_4_ * auVar45._0_4_;
      auVar79._4_4_ = auVar110._4_4_ * auVar45._4_4_;
      auVar79._8_4_ = auVar110._8_4_ * auVar45._8_4_;
      auVar79._12_4_ = auVar110._12_4_ * auVar45._12_4_;
      auVar91 = vfmsub231ps_fma(auVar79,auVar104,auVar63);
      auVar64._0_4_ = auVar84._0_4_ * auVar63._0_4_;
      auVar64._4_4_ = auVar84._4_4_ * auVar63._4_4_;
      auVar64._8_4_ = auVar84._8_4_ * auVar63._8_4_;
      auVar64._12_4_ = auVar84._12_4_ * auVar63._12_4_;
      auVar90 = vfmsub231ps_fma(auVar64,auVar110,auVar52);
      auVar53._0_4_ = auVar104._0_4_ * auVar52._0_4_;
      auVar53._4_4_ = auVar104._4_4_ * auVar52._4_4_;
      auVar53._8_4_ = auVar104._8_4_ * auVar52._8_4_;
      auVar53._12_4_ = auVar104._12_4_ * auVar52._12_4_;
      auVar116 = vfmsub231ps_fma(auVar53,auVar84,auVar45);
      auVar46._0_4_ = fVar15 * auVar116._0_4_;
      auVar46._4_4_ = fVar16 * auVar116._4_4_;
      auVar46._8_4_ = fVar17 * auVar116._8_4_;
      auVar46._12_4_ = fVar18 * auVar116._12_4_;
      auVar90 = vfmadd231ps_fma(auVar46,auVar57,auVar90);
      auVar116 = vfmadd231ps_fma(auVar90,auVar58,auVar91);
      auVar86._0_4_ = auVar116._0_4_ + auVar93._0_4_ + auVar85._0_4_;
      auVar86._4_4_ = auVar116._4_4_ + auVar93._4_4_ + auVar85._4_4_;
      auVar86._8_4_ = auVar116._8_4_ + auVar93._8_4_ + auVar85._8_4_;
      auVar86._12_4_ = auVar116._12_4_ + auVar93._12_4_ + auVar85._12_4_;
      auVar90 = vandps_avx(auVar72,auVar86);
      auVar54._0_4_ = auVar90._0_4_ * 1.1920929e-07;
      auVar54._4_4_ = auVar90._4_4_ * 1.1920929e-07;
      auVar54._8_4_ = auVar90._8_4_ * 1.1920929e-07;
      auVar54._12_4_ = auVar90._12_4_ * 1.1920929e-07;
      auVar90 = vminps_avx(auVar93,auVar85);
      auVar90 = vminps_avx(auVar90,auVar116);
      uVar27 = CONCAT44(auVar54._4_4_,auVar54._0_4_);
      auVar80._0_8_ = uVar27 ^ 0x8000000080000000;
      auVar80._8_4_ = -auVar54._8_4_;
      auVar80._12_4_ = -auVar54._12_4_;
      auVar90 = vcmpps_avx(auVar90,auVar80,5);
      auVar91 = vmaxps_avx(auVar93,auVar85);
      auVar91 = vmaxps_avx(auVar91,auVar116);
      auVar91 = vcmpps_avx(auVar91,auVar54,2);
      auVar90 = vorps_avx(auVar90,auVar91);
      auVar91 = auVar77 & auVar90;
      auVar90 = vandps_avx(auVar90,auVar77);
      if ((((auVar91 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar91 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar91 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar91[0xf])
      {
        auVar57 = vpcmpeqd_avx(auVar78,auVar78);
      }
      else {
        auVar47._0_4_ = fVar109 * auVar74._0_4_;
        auVar47._4_4_ = fVar113 * auVar74._4_4_;
        auVar47._8_4_ = fVar114 * auVar74._8_4_;
        auVar47._12_4_ = fVar115 * auVar74._12_4_;
        auVar116 = vfmsub213ps_fma(auVar62,auVar78,auVar47);
        auVar65._0_4_ = auVar104._0_4_ * fVar119;
        auVar65._4_4_ = auVar104._4_4_ * fVar122;
        auVar65._8_4_ = auVar104._8_4_ * fVar123;
        auVar65._12_4_ = auVar104._12_4_ * fVar124;
        auVar81._0_4_ = fVar11 * auVar110._0_4_;
        auVar81._4_4_ = fVar12 * auVar110._4_4_;
        auVar81._8_4_ = fVar13 * auVar110._8_4_;
        auVar81._12_4_ = fVar14 * auVar110._12_4_;
        auVar44 = vfmsub213ps_fma(auVar110,auVar75,auVar65);
        auVar91 = vandps_avx(auVar72,auVar47);
        auVar110 = vandps_avx(auVar72,auVar65);
        auVar91 = vcmpps_avx(auVar91,auVar110,1);
        auVar116 = vblendvps_avx(auVar44,auVar116,auVar91);
        auVar87._0_4_ = auVar84._0_4_ * fVar109;
        auVar87._4_4_ = auVar84._4_4_ * fVar113;
        auVar87._8_4_ = auVar84._8_4_ * fVar114;
        auVar87._12_4_ = auVar84._12_4_ * fVar115;
        auVar44 = vfmsub213ps_fma(auVar84,auVar78,auVar81);
        auVar66._0_4_ = fVar119 * auVar51._0_4_;
        auVar66._4_4_ = fVar122 * auVar51._4_4_;
        auVar66._8_4_ = fVar123 * auVar51._8_4_;
        auVar66._12_4_ = fVar124 * auVar51._12_4_;
        auVar46 = vfmsub213ps_fma(auVar74,auVar76,auVar66);
        auVar91 = vandps_avx(auVar72,auVar66);
        auVar110 = vandps_avx(auVar72,auVar81);
        auVar91 = vcmpps_avx(auVar91,auVar110,1);
        auVar110 = vblendvps_avx(auVar44,auVar46,auVar91);
        auVar22._4_4_ = fVar12 * auVar62._4_4_;
        auVar22._0_4_ = fVar11 * auVar62._0_4_;
        auVar22._8_4_ = fVar13 * auVar62._8_4_;
        auVar22._12_4_ = fVar14 * auVar62._12_4_;
        auVar44 = vfmsub213ps_fma(auVar51,auVar75,auVar22);
        auVar46 = vfmsub213ps_fma(auVar104,auVar76,auVar87);
        auVar91 = vandps_avx(auVar72,auVar22);
        auVar104 = vandps_avx(auVar72,auVar87);
        auVar91 = vcmpps_avx(auVar91,auVar104,1);
        auVar91 = vblendvps_avx(auVar46,auVar44,auVar91);
        local_1a98 = auVar23._0_4_;
        fStack_1a94 = auVar23._4_4_;
        fStack_1a90 = auVar23._8_4_;
        auVar55._0_4_ = auVar91._0_4_ * local_1a98;
        auVar55._4_4_ = auVar91._4_4_ * fStack_1a94;
        auVar55._8_4_ = auVar91._8_4_ * fStack_1a90;
        auVar55._12_4_ = auVar91._12_4_ * fVar18;
        auVar57 = vfmadd213ps_fma(auVar57,auVar110,auVar55);
        auVar57 = vfmadd213ps_fma(auVar58,auVar116,auVar57);
        auVar56._0_4_ = auVar57._0_4_ + auVar57._0_4_;
        auVar56._4_4_ = auVar57._4_4_ + auVar57._4_4_;
        auVar56._8_4_ = auVar57._8_4_ + auVar57._8_4_;
        auVar56._12_4_ = auVar57._12_4_ + auVar57._12_4_;
        auVar88._0_4_ = auVar91._0_4_ * fVar2;
        auVar88._4_4_ = auVar91._4_4_ * fVar7;
        auVar88._8_4_ = auVar91._8_4_ * fVar8;
        auVar88._12_4_ = auVar91._12_4_ * fVar9;
        auVar57 = vfmadd213ps_fma(auVar103,auVar110,auVar88);
        auVar58 = vfmadd213ps_fma(auVar92,auVar116,auVar57);
        auVar57 = vrcpps_avx(auVar56);
        auVar106._8_4_ = 0x3f800000;
        auVar106._0_8_ = &DAT_3f8000003f800000;
        auVar106._12_4_ = 0x3f800000;
        auVar92 = vfnmadd213ps_fma(auVar57,auVar56,auVar106);
        auVar57 = vfmadd132ps_fma(auVar92,auVar57,auVar57);
        auVar89._0_4_ = auVar57._0_4_ * (auVar58._0_4_ + auVar58._0_4_);
        auVar89._4_4_ = auVar57._4_4_ * (auVar58._4_4_ + auVar58._4_4_);
        auVar89._8_4_ = auVar57._8_4_ * (auVar58._8_4_ + auVar58._8_4_);
        auVar89._12_4_ = auVar57._12_4_ * (auVar58._12_4_ + auVar58._12_4_);
        auVar57 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar89,2);
        auVar58 = vcmpps_avx(auVar89,*(undefined1 (*) [16])(ray + 0x80),2);
        auVar57 = vandps_avx(auVar58,auVar57);
        uVar27 = CONCAT44(auVar56._4_4_,auVar56._0_4_);
        auVar102._0_8_ = uVar27 ^ 0x8000000080000000;
        auVar102._8_4_ = -auVar56._8_4_;
        auVar102._12_4_ = -auVar56._12_4_;
        auVar58 = vcmpps_avx(auVar102,auVar56,4);
        auVar57 = vandps_avx(auVar58,auVar57);
        auVar57 = vpslld_avx(auVar57,0x1f);
        auVar58 = vpsrad_avx(auVar57,0x1f);
        auVar57 = auVar90 & auVar58;
        auVar90 = vandps_avx(auVar58,auVar90);
        if ((((auVar57 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar57 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar57 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar57[0xf] < '\0') {
          local_18b8 = auVar91;
          local_18a8 = auVar110;
          local_1898 = auVar116;
          local_1888 = auVar89;
          local_1878 = auVar86;
          _local_1868 = auVar85;
          _local_1858 = auVar93;
        }
        auVar57 = vpcmpeqd_avx(auVar78,auVar78);
      }
      auVar121 = ZEXT1664(auVar57);
      auVar118 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
      auVar117 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      auVar108 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
      uVar3 = *(uint *)((long)&local_1778 + uVar33 * 4);
      pGVar5 = (context->scene->geometries).items[uVar3].ptr;
      uVar25 = pGVar5->mask;
      auVar48._4_4_ = uVar25;
      auVar48._0_4_ = uVar25;
      auVar48._8_4_ = uVar25;
      auVar48._12_4_ = uVar25;
      auVar58 = vpand_avx(auVar48,*(undefined1 (*) [16])(ray + 0x90));
      auVar58 = vpcmpeqd_avx(auVar58,_DAT_01feba10);
      auVar91 = auVar90 & ~auVar58;
      if ((((auVar91 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar91 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar91 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar91[0xf] < '\0'
         ) {
        uVar28 = *(undefined4 *)((long)&local_1788 + uVar33 * 4);
        auVar58 = vandnps_avx(auVar58,auVar90);
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar90 = vandps_avx(auVar72,local_1878);
          auVar91 = vrcpps_avx(local_1878);
          auVar82._8_4_ = 0x3f800000;
          auVar82._0_8_ = &DAT_3f8000003f800000;
          auVar82._12_4_ = 0x3f800000;
          auVar92 = vfnmadd213ps_fma(auVar91,local_1878,auVar82);
          auVar91 = vfmadd132ps_fma(auVar92,auVar91,auVar91);
          auVar67._8_4_ = 0x219392ef;
          auVar67._0_8_ = 0x219392ef219392ef;
          auVar67._12_4_ = 0x219392ef;
          auVar90 = vcmpps_avx(auVar90,auVar67,5);
          auVar90 = vandps_avx(auVar90,auVar91);
          auVar68._0_4_ = auVar90._0_4_ * (float)local_1858._0_4_;
          auVar68._4_4_ = auVar90._4_4_ * (float)local_1858._4_4_;
          auVar68._8_4_ = auVar90._8_4_ * fStack_1850;
          auVar68._12_4_ = auVar90._12_4_ * fStack_184c;
          local_1738 = vminps_avx(auVar68,auVar82);
          auVar59._0_4_ = auVar90._0_4_ * (float)local_1868._0_4_;
          auVar59._4_4_ = auVar90._4_4_ * (float)local_1868._4_4_;
          auVar59._8_4_ = auVar90._8_4_ * fStack_1860;
          auVar59._12_4_ = auVar90._12_4_ * fStack_185c;
          local_1728 = vminps_avx(auVar59,auVar82);
          local_1718._4_4_ = uVar28;
          local_1718._0_4_ = uVar28;
          local_1718._8_4_ = uVar28;
          local_1718._12_4_ = uVar28;
          local_1768 = local_1898._0_8_;
          uStack_1760 = local_1898._8_8_;
          local_1758 = local_18a8._0_8_;
          uStack_1750 = local_18a8._8_8_;
          local_1748 = local_18b8;
          local_1708 = uVar3;
          uStack_1704 = uVar3;
          uStack_1700 = uVar3;
          uStack_16fc = uVar3;
          vpcmpeqd_avx2(ZEXT1632(local_1728),ZEXT1632(local_1728));
          uStack_16f4 = context->user->instID[0];
          local_16f8 = uStack_16f4;
          uStack_16f0 = uStack_16f4;
          uStack_16ec = uStack_16f4;
          uStack_16e8 = context->user->instPrimID[0];
          uStack_16e4 = uStack_16e8;
          uStack_16e0 = uStack_16e8;
          uStack_16dc = uStack_16e8;
          auVar90 = *(undefined1 (*) [16])(ray + 0x80);
          auVar91 = vblendvps_avx(auVar90,local_1888,auVar58);
          *(undefined1 (*) [16])(ray + 0x80) = auVar91;
          args.valid = (int *)local_1a18;
          args.geometryUserPtr = pGVar5->userPtr;
          args.context = context->user;
          args.hit = (RTCHitN *)&local_1768;
          args.N = 4;
          local_1a18 = auVar58;
          args.ray = (RTCRayN *)ray;
          if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar5->occlusionFilterN)(&args);
            auVar118 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
            auVar108 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
            auVar117 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          }
          if (local_1a18 == (undefined1  [16])0x0) {
            auVar58 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
            auVar57 = vpcmpeqd_avx(auVar57,auVar57);
            auVar121 = ZEXT1664(auVar57);
            auVar57 = auVar57 ^ auVar58;
          }
          else {
            p_Var6 = context->args->filter;
            auVar57 = vpcmpeqd_avx(auVar57,auVar57);
            auVar121 = ZEXT1664(auVar57);
            if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var6)(&args);
              auVar57 = vpcmpeqd_avx(auVar57,auVar57);
              auVar121 = ZEXT1664(auVar57);
              auVar118 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
              auVar108 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
              auVar117 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            }
            auVar58 = vpcmpeqd_avx((undefined1  [16])0x0,local_1a18);
            auVar57 = auVar121._0_16_ ^ auVar58;
            auVar69._8_4_ = 0xff800000;
            auVar69._0_8_ = 0xff800000ff800000;
            auVar69._12_4_ = 0xff800000;
            auVar58 = vblendvps_avx(auVar69,*(undefined1 (*) [16])(args.ray + 0x80),auVar58);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar58;
          }
          auVar57 = vpslld_avx(auVar57,0x1f);
          auVar58 = vpsrad_avx(auVar57,0x1f);
          auVar57 = vblendvps_avx(auVar90,*(undefined1 (*) [16])pRVar1,auVar57);
          *(undefined1 (*) [16])pRVar1 = auVar57;
        }
        auVar77 = vpandn_avx(auVar58,auVar77);
      }
      auVar112 = ZEXT1664(auVar72);
      if (((((auVar77 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
            (auVar77 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar77 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar77[0xf])
         || (bVar36 = 2 < uVar33, uVar33 = uVar33 + 1, bVar36)) break;
    }
    auVar57 = vpand_avx(auVar77,auVar71);
    auVar71 = auVar71 & auVar77;
    if ((((auVar71 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar71 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar71 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar71[0xf])
    break;
  }
  terminated.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar121._0_16_ ^ auVar57);
LAB_0053b3f7:
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vpor_avx((undefined1  [16])vVar24.field_0,(undefined1  [16])terminated.field_0);
  auVar71 = auVar121._0_16_ & ~(undefined1  [16])terminated.field_0;
  if ((((auVar71 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar71 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar71 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar71[0xf]) {
LAB_0053b432:
    iVar26 = 3;
  }
  else {
    auVar70._8_4_ = 0xff800000;
    auVar70._0_8_ = 0xff800000ff800000;
    auVar70._12_4_ = 0xff800000;
    tray.tfar.field_0 =
         (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
         vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar70,
                       (undefined1  [16])terminated.field_0);
    iVar26 = 0;
  }
LAB_0053b435:
  if (iVar26 == 3) {
    auVar10 = vandps_avx(auVar10,(undefined1  [16])terminated.field_0);
    auVar60._8_4_ = 0xff800000;
    auVar60._0_8_ = 0xff800000ff800000;
    auVar60._12_4_ = 0xff800000;
    auVar10 = vmaskmovps_avx(auVar10,auVar60);
    *(undefined1 (*) [16])pRVar1 = auVar10;
    return;
  }
  goto LAB_0053a932;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }